

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void google::protobuf::internal::GenericSwap(MessageLite *m1,MessageLite *m2)

{
  int iVar1;
  undefined4 extraout_var;
  long *plVar2;
  
  iVar1 = (*m1->_vptr_MessageLite[3])();
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  (**(code **)(*plVar2 + 0x40))(plVar2,m1);
  (*m1->_vptr_MessageLite[5])(m1);
  (*m1->_vptr_MessageLite[8])(m1,m2);
  (*m2->_vptr_MessageLite[5])(m2);
  (*m2->_vptr_MessageLite[8])(m2,plVar2);
  (**(code **)(*plVar2 + 8))(plVar2);
  return;
}

Assistant:

void GenericSwap(MessageLite* m1, MessageLite* m2) {
  std::unique_ptr<MessageLite> tmp(m1->New());
  tmp->CheckTypeAndMergeFrom(*m1);
  m1->Clear();
  m1->CheckTypeAndMergeFrom(*m2);
  m2->Clear();
  m2->CheckTypeAndMergeFrom(*tmp);
}